

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O3

CURLcode ws_setup_conn(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  CURLcode CVar2;
  
  puVar1 = &(data->state).http_neg.field_0x3;
  *puVar1 = *puVar1 & 0xf3;
  (data->state).http_neg.wanted = '\x01';
  (data->state).http_neg.allowed = '\x01';
  CVar2 = Curl_http_setup_conn(data,conn);
  return CVar2;
}

Assistant:

static CURLcode ws_setup_conn(struct Curl_easy *data,
                              struct connectdata *conn)
{
  /* WebSockets is 1.1 only (for now) */
  data->state.http_neg.accept_09 = FALSE;
  data->state.http_neg.only_10 = FALSE;
  data->state.http_neg.wanted = CURL_HTTP_V1x;
  data->state.http_neg.allowed = CURL_HTTP_V1x;
  return Curl_http_setup_conn(data, conn);
}